

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

uint32_t mp_decode_array(char **data)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  
  pbVar2 = (byte *)*data;
  bVar1 = *pbVar2;
  *data = (char *)(pbVar2 + 1);
  if ((bVar1 & 0x40) == 0) {
    uVar3 = bVar1 & 0xf;
  }
  else {
    if ((bVar1 & 1) == 0) {
      pbVar4 = pbVar2 + 3;
      uVar3 = (uint)(ushort)(*(ushort *)(pbVar2 + 1) << 8 | *(ushort *)(pbVar2 + 1) >> 8);
    }
    else {
      uVar3 = *(uint *)(pbVar2 + 1);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      pbVar4 = pbVar2 + 5;
    }
    *data = (char *)pbVar4;
  }
  return uVar3;
}

Assistant:

MP_IMPL MP_ALWAYSINLINE uint32_t
mp_decode_array(const char **data)
{
	uint8_t c = mp_load_u8(data);

	if (mp_likely(!(c & 0x40)))
		return (c & 0xf);

	return mp_decode_array_slowpath(c, data);
}